

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ProcessPropertySymUse(BackwardPass *this,PropertySym *propertySym)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  bool isLive;
  BasicBlock *block;
  PropertySym *propertySym_local;
  BackwardPass *this_local;
  
  if (this->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x18e9,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pBVar1 = this->currentBlock;
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                    (pBVar1->upwardExposedFields,(propertySym->super_Sym).m_id);
  if (propertySym->m_propertyEquivSet != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Or
              (pBVar1->upwardExposedFields,propertySym->m_propertyEquivSet);
  }
  return BVar4 != '\0';
}

Assistant:

bool
BackwardPass::ProcessPropertySymUse(PropertySym *propertySym)
{
    Assert(this->tag == Js::BackwardPhase);

    BasicBlock *block = this->currentBlock;

    bool isLive = !!block->upwardExposedFields->TestAndSet(propertySym->m_id);

    if (propertySym->m_propertyEquivSet)
    {
        block->upwardExposedFields->Or(propertySym->m_propertyEquivSet);
    }

    return isLive;
}